

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_GetNodes
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,NodeList_t *Nodes)

{
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  undefined8 in_RSI;
  long in_RDI;
  undefined3 in_stack_ffffffffffffff38;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  ExceptionReporter<GenICam_3_4::AccessException> *in_stack_ffffffffffffff50;
  
  if (*(long *)(in_RDI + 8) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),in_RSI);
    return;
  }
  uVar1 = CONCAT13(1,in_stack_ffffffffffffff38);
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar1));
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,&stack0xffffffffffffff48,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::AccessException::~AccessException);
}

Assistant:

inline void CNodeMapRefT<TCameraParams>::_GetNodes(NodeList_t &Nodes) const
    {
        if(_Ptr)
            return _Ptr->GetNodes(Nodes);
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }